

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

InputList * __thiscall Omega_h::InputMap::get_list(InputMap *this,string *name)

{
  bool bVar1;
  InputList *pIVar2;
  undefined1 local_28 [8];
  shared_ptr<Omega_h::Input> sptr;
  string *name_local;
  InputMap *this_local;
  
  sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  bVar1 = is_list(this,name);
  if (!bVar1) {
    pIVar2 = (InputList *)operator_new(0x30);
    (pIVar2->entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar2->entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(pIVar2->super_Input).used = 0;
    (pIVar2->entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar2->super_Input)._vptr_Input = (_func_int **)0x0;
    (pIVar2->super_Input).parent = (Input *)0x0;
    InputList::InputList(pIVar2);
    std::shared_ptr<Omega_h::Input>::shared_ptr<Omega_h::InputList,void>
              ((shared_ptr<Omega_h::Input> *)local_28,pIVar2);
    add(this,(string *)
             sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
        (shared_ptr<Omega_h::Input> *)local_28);
    std::shared_ptr<Omega_h::Input>::~shared_ptr((shared_ptr<Omega_h::Input> *)local_28);
  }
  pIVar2 = use_input<Omega_h::InputList>
                     (this,(string *)
                           sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
  return pIVar2;
}

Assistant:

InputList& InputMap::get_list(std::string const& name) {
  if (!is_list(name)) {
    std::shared_ptr<Input> sptr(new InputList());
    this->add(name, std::move(sptr));
  }
  return this->use_input<InputList>(name);
}